

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  bool bVar1;
  int extraout_EAX;
  TrackerBase *pTVar2;
  ITracker *pIVar3;
  ReusableStringStream *in_stack_fffffffffffffec8;
  ReusableStringStream *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffef0;
  string *msg;
  ReusableStringStream *in_stack_ffffffffffffff00;
  string local_c0 [2];
  SourceLineInfo local_68 [5];
  shared_ptr<Catch::TestCaseTracking::ITracker> *local_18;
  shared_ptr<Catch::TestCaseTracking::ITracker> *local_10;
  TrackerBase *local_8;
  
  local_8 = this;
  while (pTVar2 = (TrackerBase *)TrackerContext::currentTracker(this->m_ctx), pTVar2 != this) {
    pIVar3 = TrackerContext::currentTracker(this->m_ctx);
    (*pIVar3->_vptr_ITracker[8])();
  }
  switch(this->m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff00);
    SourceLineInfo::SourceLineInfo
              (local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/../third_party/catch/catch.hpp"
               ,0x390a);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffed0,(SourceLineInfo *)in_stack_fffffffffffffec8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffed0,(char (*) [26])in_stack_fffffffffffffec8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffed0,(char (*) [18])in_stack_fffffffffffffec8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffed0,(CycleState *)in_stack_fffffffffffffec8);
    ReusableStringStream::str_abi_cxx11_(in_stack_fffffffffffffec8);
    throw_logic_error(in_stack_fffffffffffffef0);
  case Executing:
    this->m_runState = CompletedSuccessfully;
    break;
  case ExecutingChildren:
    local_10 = (shared_ptr<Catch::TestCaseTracking::ITracker> *)
               clara::std::
               vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
               ::begin((vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
                        *)in_stack_fffffffffffffec8);
    local_18 = (shared_ptr<Catch::TestCaseTracking::ITracker> *)
               clara::std::
               vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
               ::end((vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
                      *)in_stack_fffffffffffffec8);
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>*,std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>>>>,Catch::TestCaseTracking::TrackerBase::close()::__0>
                      (local_10,local_18);
    if (bVar1) {
      this->m_runState = CompletedSuccessfully;
    }
    break;
  case NeedsAnotherRun:
    break;
  default:
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff00);
    msg = local_c0;
    SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)msg,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/../third_party/catch/catch.hpp"
               ,0x390d);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffed0,(SourceLineInfo *)in_stack_fffffffffffffec8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffed0,(char (*) [26])in_stack_fffffffffffffec8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffed0,(char (*) [16])in_stack_fffffffffffffec8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffed0,(CycleState *)in_stack_fffffffffffffec8);
    ReusableStringStream::str_abi_cxx11_(in_stack_fffffffffffffec8);
    throw_logic_error(msg);
  }
  moveToParent((TrackerBase *)0x2708c3);
  TrackerContext::completeCycle(this->m_ctx);
  return extraout_EAX;
}

Assistant:

void TrackerBase::close() {

        // Close any still open children (e.g. generators)
        while( &m_ctx.currentTracker() != this )
            m_ctx.currentTracker().close();

        switch( m_runState ) {
            case NeedsAnotherRun:
                break;

            case Executing:
                m_runState = CompletedSuccessfully;
                break;
            case ExecutingChildren:
                if( std::all_of(m_children.begin(), m_children.end(), [](ITrackerPtr const& t){ return t->isComplete(); }) )
                    m_runState = CompletedSuccessfully;
                break;

            case NotStarted:
            case CompletedSuccessfully:
            case Failed:
                CATCH_INTERNAL_ERROR( "Illogical state: " << m_runState );

            default:
                CATCH_INTERNAL_ERROR( "Unknown state: " << m_runState );
        }
        moveToParent();
        m_ctx.completeCycle();
    }